

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volk.c
# Opt level: O0

void volkGenLoadLoader(void *context,_func_PFN_vkVoidFunction_void_ptr_char_ptr *load)

{
  _func_PFN_vkVoidFunction_void_ptr_char_ptr *load_local;
  void *context_local;
  
  vkCreateInstance = (PFN_vkCreateInstance)(*load)(context,"vkCreateInstance");
  vkEnumerateInstanceExtensionProperties =
       (PFN_vkEnumerateInstanceExtensionProperties)
       (*load)(context,"vkEnumerateInstanceExtensionProperties");
  vkEnumerateInstanceLayerProperties =
       (PFN_vkEnumerateInstanceLayerProperties)(*load)(context,"vkEnumerateInstanceLayerProperties")
  ;
  vkEnumerateInstanceVersion =
       (PFN_vkEnumerateInstanceVersion)(*load)(context,"vkEnumerateInstanceVersion");
  return;
}

Assistant:

static void volkGenLoadLoader(void* context, PFN_vkVoidFunction (*load)(void*, const char*))
{
	/* VOLK_GENERATE_LOAD_LOADER */
#if defined(VK_VERSION_1_0)
	vkCreateInstance = (PFN_vkCreateInstance)load(context, "vkCreateInstance");
	vkEnumerateInstanceExtensionProperties = (PFN_vkEnumerateInstanceExtensionProperties)load(context, "vkEnumerateInstanceExtensionProperties");
	vkEnumerateInstanceLayerProperties = (PFN_vkEnumerateInstanceLayerProperties)load(context, "vkEnumerateInstanceLayerProperties");
#endif /* defined(VK_VERSION_1_0) */
#if defined(VK_VERSION_1_1)
	vkEnumerateInstanceVersion = (PFN_vkEnumerateInstanceVersion)load(context, "vkEnumerateInstanceVersion");
#endif /* defined(VK_VERSION_1_1) */
	/* VOLK_GENERATE_LOAD_LOADER */
}